

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<VkSpecParser::TypedName>::data(QList<VkSpecParser::TypedName> *this)

{
  QArrayDataPointer<VkSpecParser::TypedName> *this_00;
  TypedName *pTVar1;
  QArrayDataPointer<VkSpecParser::TypedName> *in_RDI;
  
  detach((QList<VkSpecParser::TypedName> *)0x11648c);
  this_00 = (QArrayDataPointer<VkSpecParser::TypedName> *)
            QArrayDataPointer<VkSpecParser::TypedName>::operator->(in_RDI);
  pTVar1 = QArrayDataPointer<VkSpecParser::TypedName>::data(this_00);
  return pTVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }